

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.h
# Opt level: O0

void __thiscall wasm::Fatal::~Fatal(Fatal *this)

{
  ostream *this_00;
  undefined8 extraout_RAX;
  string local_30 [32];
  Fatal *local_10;
  Fatal *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::str();
  this_00 = std::operator<<((ostream *)&std::cerr,local_30);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  _Exit(1);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

[[noreturn]] ~Fatal() {
    std::cerr << buffer.str() << std::endl;
    // Use _Exit here to avoid calling static destructors. This avoids deadlocks
    // in (for example) the thread worker pool, where workers hold a lock while
    // performing their work.
    _Exit(EXIT_FAILURE);
  }